

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops-h1.c
# Opt level: O3

int rops_adoption_bind_h1(lws *wsi,int type,char *vh_prot_name)

{
  lws_vhost *plVar1;
  int iVar2;
  lws_protocols *plVar3;
  lwsi_state state;
  
  iVar2 = 0;
  if ((type & 1U) != 0) {
    if (((uint)type >> 0x18 & 1) == 0) {
      state = LRS_SSL_INIT;
      if (((type & 4U) == 0) &&
         (state = LRS_HEADERS, (((wsi->a).vhost)->options & 0x400000000) != 0)) {
        _lws_log(8,"http/2 prior knowledge\n");
        lws_role_call_alpn_negotiated(wsi,"h2");
      }
      else {
        lws_role_transition(wsi,0x20000000,state,&role_ops_h1);
      }
      plVar1 = (wsi->a).vhost;
      if ((vh_prot_name == (char *)0x0) &&
         ((int)(uint)plVar1->default_protocol_index < plVar1->count_protocols)) {
        plVar3 = plVar1->protocols + plVar1->default_protocol_index;
      }
      else {
        plVar3 = plVar1->protocols;
      }
      (wsi->a).protocol = plVar3;
      lws_set_timeout(wsi,PENDING_TIMEOUT_ESTABLISH_WITH_SERVER,((wsi->a).context)->timeout_secs);
    }
    else {
      if (wsi->role_ops != &role_ops_h1 && wsi->role_ops != &role_ops_h2) {
        return 0;
      }
      iVar2 = lws_header_table_attach(wsi,0);
      if (iVar2 == 0) {
        _lws_log(0x10,"Attached ah immediately\n");
      }
      else {
        _lws_log(8,"%s: waiting for ah\n","rops_adoption_bind_h1");
      }
    }
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int
rops_adoption_bind_h1(struct lws *wsi, int type, const char *vh_prot_name)
{
	if (!(type & LWS_ADOPT_HTTP))
		return 0; /* no match */

	if (type & _LWS_ADOPT_FINISH && !lwsi_role_http(wsi))
		return 0;

	if (type & _LWS_ADOPT_FINISH) {
		if (!lws_header_table_attach(wsi, 0))
			lwsl_debug("Attached ah immediately\n");
		else
			lwsl_info("%s: waiting for ah\n", __func__);

		return 1;
	}

#if defined(LWS_WITH_SERVER) && defined(LWS_WITH_SECURE_STREAMS)
	if (wsi->a.vhost->ss_handle &&
	    wsi->a.vhost->ss_handle->policy->protocol == LWSSSP_RAW) {
		lws_role_transition(wsi, LWSIFR_SERVER, (type & LWS_ADOPT_ALLOW_SSL) ?
				LRS_SSL_INIT : LRS_ESTABLISHED, &role_ops_raw_skt);
		return 1;
	}
#endif

	/* If Non-TLS and HTTP2 prior knowledge is enabled, skip to clear text HTTP2 */

#if defined(LWS_WITH_HTTP2)
	if ((!(type & LWS_ADOPT_ALLOW_SSL)) && (wsi->a.vhost->options & LWS_SERVER_OPTION_H2_PRIOR_KNOWLEDGE)) {
		lwsl_info("http/2 prior knowledge\n");
		lws_metrics_tag_wsi_add(wsi, "upg", "h2_prior");
		lws_role_call_alpn_negotiated(wsi, "h2");
	}
	else
#endif
		lws_role_transition(wsi, LWSIFR_SERVER, (type & LWS_ADOPT_ALLOW_SSL) ?
				LRS_SSL_INIT : LRS_HEADERS, &role_ops_h1);

	/*
	 * Otherwise, we have to bind to h1 as a default even when we're actually going to
	 * replace it as an h2 bind later.  So don't take this seriously if the
	 * default is disabled (ws upgrade caees properly about it)
	 */

	if (!vh_prot_name && wsi->a.vhost->default_protocol_index <
			     wsi->a.vhost->count_protocols)
		wsi->a.protocol = &wsi->a.vhost->protocols[
				wsi->a.vhost->default_protocol_index];
	else
		wsi->a.protocol = &wsi->a.vhost->protocols[0];

	/* the transport is accepted... give him time to negotiate */
	lws_set_timeout(wsi, PENDING_TIMEOUT_ESTABLISH_WITH_SERVER,
			(int)wsi->a.context->timeout_secs);

	return 1; /* bound */
}